

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBiasLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  RepeatedField<unsigned_long> *this_00;
  uint64_t outChannels;
  string *psVar1;
  bool bVar2;
  LayerUnion LVar3;
  long *plVar4;
  unsigned_long *puVar5;
  size_type *psVar6;
  Result *_result;
  uint uVar7;
  pointer pcVar8;
  WeightParams *pWVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  uint64_t expectedUnits;
  string err;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  LayerUnion local_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (bVar2) {
    pcVar8 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar10 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar8 != paVar10) {
      operator_delete(pcVar8,paVar10->_M_allocated_capacity + 1);
    }
    if (bVar2) {
      validateOutputCount(__return_storage_ptr__,layer,1,1);
      bVar2 = Result::good(__return_storage_ptr__);
      if (bVar2) {
        pcVar8 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar8 != paVar10) {
          operator_delete(pcVar8,paVar10->_M_allocated_capacity + 1);
        }
        if (bVar2) {
          if (this->ndArrayInterpretation == true) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Bias","");
            validateInputOutputRankEquality
                      (__return_storage_ptr__,layer,&local_70,&this->blobNameToRank);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            bVar2 = Result::good(__return_storage_ptr__);
            if (!bVar2) {
              return __return_storage_ptr__;
            }
            pcVar8 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            paVar10 = &(__return_storage_ptr__->m_message).field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar8 != paVar10) {
              operator_delete(pcVar8,paVar10->_M_allocated_capacity + 1);
            }
            if (!bVar2) {
              return __return_storage_ptr__;
            }
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Bias","");
            validateRankCount(__return_storage_ptr__,layer,&local_f8,3,-1,&this->blobNameToRank);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            bVar2 = Result::good(__return_storage_ptr__);
            if (!bVar2) {
              return __return_storage_ptr__;
            }
            pcVar8 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar8 != paVar10) {
              operator_delete(pcVar8,paVar10->_M_allocated_capacity + 1);
            }
            if (!bVar2) {
              return __return_storage_ptr__;
            }
          }
          if (layer->_oneof_case_[0] == 0xfa) {
            LVar3 = layer->layer_;
          }
          else {
            LVar3.bias_ = Specification::BiasLayerParams::default_instance();
          }
          pWVar9 = (LVar3.batchnorm_)->variance_;
          if (pWVar9 == (WeightParams *)0x0) {
            pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          bVar2 = 0 < (pWVar9->floatvalue_).current_size_;
          uVar7 = bVar2 + 1;
          if (((pWVar9->float16value_).ptr_)->_M_string_length == 0) {
            uVar7 = (uint)bVar2;
          }
          if (((uVar7 - (((pWVar9->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
              (uint)(((pWVar9->int8rawvalue_).ptr_)->_M_string_length == 0) < 2) {
            this_00 = &(LVar3.convolution_)->kernelsize_;
            if ((((LVar3.convolution_)->kernelsize_).current_size_ | 2U) == 3) {
              uVar7 = 0;
              if (this_00->current_size_ < 1) {
                expectedUnits = 1;
              }
              else {
                expectedUnits = 1;
                local_98 = LVar3;
                do {
                  puVar5 = google::protobuf::RepeatedField<unsigned_long>::Get(this_00,uVar7);
                  expectedUnits = expectedUnits * *puVar5;
                  uVar7 = uVar7 + 1;
                } while ((int)uVar7 < this_00->current_size_);
                uVar7 = (uint)(this_00->current_size_ == 3);
                LVar3 = local_98;
              }
              if (((char)uVar7 == '\0') ||
                 (((LVar3.innerproduct_)->bias_->_internal_metadata_).
                  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                  .ptr_ < (void *)0x2)) {
                pWVar9 = (LVar3.batchnorm_)->variance_;
                if (pWVar9 == (WeightParams *)0x0) {
                  pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                }
                local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Bias","");
                psVar1 = (layer->name_).ptr_;
                local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"bias","");
                validateGeneralWeightParams
                          (__return_storage_ptr__,pWVar9,expectedUnits,1,&local_f8,psVar1,&local_d8)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                  operator_delete(local_d8._M_dataplus._M_p,
                                  local_d8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  operator_delete(local_f8._M_dataplus._M_p,
                                  local_f8.field_2._M_allocated_capacity + 1);
                }
                bVar2 = Result::good(__return_storage_ptr__);
                if (!bVar2) {
                  return __return_storage_ptr__;
                }
                pcVar8 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
              }
              else {
                pWVar9 = (LVar3.batchnorm_)->variance_;
                if (pWVar9 == (WeightParams *)0x0) {
                  pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                }
                puVar5 = google::protobuf::RepeatedField<unsigned_long>::Get(this_00,0);
                outChannels = *puVar5;
                local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Bias","");
                psVar1 = (layer->name_).ptr_;
                local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"bias","");
                validateGeneralWeightParams
                          (__return_storage_ptr__,pWVar9,expectedUnits,outChannels,&local_f8,psVar1,
                           &local_d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                  operator_delete(local_d8._M_dataplus._M_p,
                                  local_d8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  operator_delete(local_f8._M_dataplus._M_p,
                                  local_f8.field_2._M_allocated_capacity + 1);
                }
                bVar2 = Result::good(__return_storage_ptr__);
                if (!bVar2) {
                  return __return_storage_ptr__;
                }
                pcVar8 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
              }
              paVar10 = &(__return_storage_ptr__->m_message).field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar8 != paVar10) {
                operator_delete(pcVar8,paVar10->_M_allocated_capacity + 1);
              }
              Result::Result(__return_storage_ptr__);
              return __return_storage_ptr__;
            }
            std::operator+(&local_50,"Bias layer \'",(layer->name_).ptr_);
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
            psVar6 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_b8.field_2._M_allocated_capacity = *psVar6;
              local_b8.field_2._8_8_ = plVar4[3];
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            }
            else {
              local_b8.field_2._M_allocated_capacity = *psVar6;
              local_b8._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_b8._M_string_length = plVar4[1];
            *plVar4 = (long)psVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::__cxx11::to_string(&local_90,this_00->current_size_);
            std::operator+(&local_d8,&local_b8,&local_90);
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
            psVar6 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_f8.field_2._M_allocated_capacity = *psVar6;
              local_f8.field_2._8_8_ = plVar4[3];
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            }
            else {
              local_f8.field_2._M_allocated_capacity = *psVar6;
              local_f8._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_f8._M_string_length = plVar4[1];
            *plVar4 = (long)psVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
              return __return_storage_ptr__;
            }
          }
          else {
            std::operator+(&local_d8,"Bias product layer \'",(layer->name_).ptr_);
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
            psVar6 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_f8.field_2._M_allocated_capacity = *psVar6;
              local_f8.field_2._8_8_ = plVar4[3];
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            }
            else {
              local_f8.field_2._M_allocated_capacity = *psVar6;
              local_f8._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_f8._M_string_length = plVar4[1];
            *plVar4 = (long)psVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
              return __return_storage_ptr__;
            }
          }
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBiasLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Bias", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Bias", 3, -1, blobNameToRank));
    }

    const auto& params = layer.bias();
    WeightParamType paramType = valueType(params.bias());

    // Only float32 or float16 parameters can be populated at any time
    if (paramType == UNSPECIFIED) {
        std::string err = "Bias product layer '" + layer.name() + "' has both full precision and half precision weights and/or bias fields populated";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (params.shape_size() != 1 && params.shape_size() != 3) {
        std::string err = "Bias layer '" + layer.name() + "' cannot be " + std::to_string(params.shape_size()) + " dimensional. Must be 1D or 3D.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // shape can be ``[1]``, ``[C]``, ``[1, H, W]`` or ``[C, H, W]``
    size_t total_shape = 1;
    for (int i = 0; i < params.shape_size(); i++) {
        total_shape *= params.shape(i);
    }
    if (params.shape_size() == 3 && params.shape(0) > 1){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.bias(), total_shape, params.shape(0), "Bias", layer.name(), "bias"));
    } else {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.bias(), total_shape, 1, "Bias", layer.name(), "bias"));
    }

    return Result();
}